

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::WriteMS<tcu::Vector<unsigned_int,4>>
          (BasicAllTargetsStore *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  char *pcVar4;
  char *src_fs;
  Vector<float,_4> local_a8;
  byte local_95;
  undefined4 local_94;
  GLuint GStack_90;
  bool status;
  int kSize;
  GLuint textures [2];
  GLuint val_program;
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<unsigned_int,_4> *expected_value_local;
  Vector<unsigned_int,_4> *write_value_local;
  BasicAllTargetsStore *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsStore *this_local;
  
  pcStack_30 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = write_value;
  write_value_local._4_4_ = internalformat;
  pBStack_10 = this;
  GenFSMS<tcu::Vector<unsigned_int,4>>(&local_58,this,internalformat,write_value);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,pcVar4,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  pcVar4 = pcStack_30;
  local_34 = GVar2;
  GenFSMSVal<tcu::Vector<unsigned_int,4>>((string *)textures,this,(Vector<unsigned_int,_4> *)src_vs)
  ;
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,pcVar4,(char *)0x0,(char *)0x0,(char *)0x0,
                     src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)textures);
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),2,&stack0xffffffffffffff70);
  local_94 = 0x10;
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9100,GStack_90);
  glu::CallLogWrapper::glTexImage2DMultisample
            ((CallLogWrapper *)(this + 8),0x9100,4,write_value_local._4_4_,0x10,0x10,'\0');
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9100,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9102,kSize);
  glu::CallLogWrapper::glTexImage3DMultisample
            ((CallLogWrapper *)(this + 8),0x9102,4,write_value_local._4_4_,0x10,0x10,2,'\0');
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9102,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,GStack_90,0,'\0',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),4,kSize,0,'\x01',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glClear((CallLogWrapper *)(this + 8),0x4000);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2dms");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2dms_array");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,4);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  local_95 = 1;
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9100,GStack_90);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c1);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x9102,kSize);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),GVar2);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),GVar2,"g_sampler_2dms");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),GVar2,"g_sampler_2dms_array");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,1);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x20);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  tcu::Vector<float,_4>::Vector(&local_a8,0.0,1.0,0.0,1.0);
  bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ValidateReadBuffer
                    ((ShaderImageLoadStoreBase *)this,0,0,0x10,0x10,&local_a8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_95 = 0;
    gl4cts::anon_unknown_0::Output
              ("GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY target failed.\n");
  }
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c0);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),2,&stack0xffffffffffffff70);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),GVar2);
  return (bool)(local_95 & 1);
}

Assistant:

bool WriteMS(GLenum internalformat, const T& write_value, const T& expected_value)
	{

		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program	 = BuildProgram(src_vs, NULL, NULL, NULL, GenFSMS(internalformat, write_value).c_str());
		const GLuint val_program = BuildProgram(src_vs, NULL, NULL, NULL, GenFSMSVal(expected_value).c_str());
		GLuint		 textures[2];
		glGenTextures(2, textures);

		const int kSize = 16;

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, textures[0]);
		glTexImage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, 4, internalformat, kSize, kSize, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, textures[1]);
		glTexImage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 4, internalformat, kSize, kSize, 2, GL_FALSE);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, 0);

		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[1], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_2dms_array"), 4);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE, textures[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, textures[1]);

		glUseProgram(val_program);
		glUniform1i(glGetUniformLocation(val_program, "g_sampler_2dms"), 0);
		glUniform1i(glGetUniformLocation(val_program, "g_sampler_2dms_array"), 1);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
			Output("GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY target failed.\n");
		}

		glActiveTexture(GL_TEXTURE0);
		glDeleteTextures(2, textures);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(val_program);

		return status;
	}